

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_refs.c
# Opt level: O3

void protect_up_cold_1(void)

{
  FILE *__stream;
  int *piVar1;
  char *pcVar2;
  
  __stream = _stderr;
  piVar1 = __errno_location();
  pcVar2 = strerror(*piVar1);
  fprintf(__stream,"refs: Unable to allocate memory: %s!\n",pcVar2);
  exit(1);
}

Assistant:

static void
protect_resize(refs_table_t *tbl)
{
    while (1) {
        uint32_t v = tbl->refs_control;
        if (v & 0xf0000000) {
            // someone else started resize
            // just rehash blocks until done
            while (protect_resize_help(tbl)) continue;
            return;
        }
        if (atomic_compare_exchange_weak(&tbl->refs_control, &v, 0x80000000 | v)) {
            // wait until all users gone
            while (tbl->refs_control != 0x80000000) continue;
            break;
        }
    }

    tbl->refs_resize_table = tbl->refs_table;
    tbl->refs_resize_size = tbl->refs_size;
    tbl->refs_resize_part = 0;
    tbl->refs_resize_done = 0;

    // calculate new size
    size_t new_size = tbl->refs_size;
    size_t count = refs_count(tbl);
    if (count*4 > tbl->refs_size) new_size *= 2;

    // allocate new table
    _Atomic(uint64_t)* new_table = (_Atomic(uint64_t)*)alloc_aligned(new_size * sizeof(uint64_t));
    if (new_table == 0) {
        fprintf(stderr, "refs: Unable to allocate memory: %s!\n", strerror(errno));
        exit(1);
    }

    // set new data and go
    tbl->refs_table = new_table;
    tbl->refs_size = new_size;
    compiler_barrier();
    tbl->refs_control = 0x40000000;

    // until all parts are done, rehash blocks
    while (tbl->refs_resize_done < tbl->refs_resize_size/128) protect_resize_help(tbl);

    // done!
    compiler_barrier();
    tbl->refs_control = 0;

    // unmap old table
    free_aligned(tbl->refs_resize_table, tbl->refs_resize_size * sizeof(uint64_t));
}